

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::HttpSocket::SendRequest(HttpSocket *this,Request *req,bool enqueue)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  size_t sVar6;
  string *psVar7;
  char *pcVar8;
  string local_1e8 [48];
  char *local_1b8;
  char *crlf;
  stringstream r;
  ostream local_1a0 [382];
  byte local_22;
  byte local_21;
  bool post;
  Request *pRStack_20;
  bool enqueue_local;
  Request *req_local;
  HttpSocket *this_local;
  
  local_21 = enqueue;
  pRStack_20 = req;
  req_local = (Request *)this;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (pRStack_20->port != 0)) {
    bVar1 = POST::empty(&pRStack_20->post);
    local_22 = !bVar1;
    std::__cxx11::stringstream::stringstream((stringstream *)&crlf);
    local_1b8 = "\r\n";
    pcVar8 = "GET ";
    if ((local_22 & 1) != 0) {
      pcVar8 = "POST ";
    }
    poVar4 = std::operator<<(local_1a0,pcVar8);
    poVar4 = std::operator<<(poVar4,(string *)&pRStack_20->resource);
    poVar4 = std::operator<<(poVar4," HTTP/1.1");
    std::operator<<(poVar4,local_1b8);
    poVar4 = std::operator<<(local_1a0,"Host: ");
    poVar4 = std::operator<<(poVar4,(string *)&pRStack_20->host);
    std::operator<<(poVar4,local_1b8);
    if (this->_keep_alive == 0) {
      poVar4 = std::operator<<(local_1a0,"Connection: close");
      std::operator<<(poVar4,local_1b8);
    }
    else {
      poVar4 = std::operator<<(local_1a0,"Connection: Keep-Alive");
      std::operator<<(poVar4,local_1b8);
      poVar4 = std::operator<<(local_1a0,"Keep-Alive: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->_keep_alive);
      std::operator<<(poVar4,local_1b8);
    }
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      poVar4 = std::operator<<(local_1a0,"User-Agent: ");
      poVar4 = std::operator<<(poVar4,(string *)&this->_user_agent);
      std::operator<<(poVar4,local_1b8);
    }
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      poVar4 = std::operator<<(local_1a0,"Accept-Encoding: ");
      poVar4 = std::operator<<(poVar4,(string *)&this->_accept_encoding);
      std::operator<<(poVar4,local_1b8);
    }
    if ((local_22 & 1) != 0) {
      poVar4 = std::operator<<(local_1a0,"Content-Length: ");
      sVar6 = POST::length(&pRStack_20->post);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
      std::operator<<(poVar4,local_1b8);
      poVar4 = std::operator<<(local_1a0,"Content-Type: application/x-www-form-urlencoded");
      std::operator<<(poVar4,local_1b8);
    }
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      std::operator<<(local_1a0,(string *)&pRStack_20->extraGetHeaders);
      psVar7 = &pRStack_20->extraGetHeaders;
      lVar5 = std::__cxx11::string::length();
      iVar2 = std::__cxx11::string::compare((ulong)psVar7,lVar5 - 2,(char *)0xffffffffffffffff);
      if (iVar2 != 0) {
        std::operator<<(local_1a0,local_1b8);
      }
    }
    std::operator<<(local_1a0,local_1b8);
    if ((local_22 & 1) != 0) {
      psVar7 = POST::str_abi_cxx11_(&pRStack_20->post);
      std::operator<<(local_1a0,(string *)psVar7);
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&pRStack_20->header,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    this_local._7_1_ = _EnqueueOrSend(this,pRStack_20,(bool)(local_21 & 1));
    std::__cxx11::stringstream::~stringstream((stringstream *)&crlf);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HttpSocket::SendRequest(Request& req, bool enqueue)
{
    if(req.host.empty() || !req.port)
        return false;

    const bool post = !req.post.empty();

    std::stringstream r;
    const char *crlf = "\r\n";
    r << (post ? "POST " : "GET ") << req.resource << " HTTP/1.1" << crlf;
    r << "Host: " << req.host << crlf;
    if(_keep_alive)
    {
        r << "Connection: Keep-Alive" << crlf;
        r << "Keep-Alive: " << _keep_alive << crlf;
    }
    else
        r << "Connection: close" << crlf;

    if(_user_agent.length())
        r << "User-Agent: " << _user_agent << crlf;

    if(_accept_encoding.length())
        r << "Accept-Encoding: " << _accept_encoding << crlf;

    if(post)
    {
        r << "Content-Length: " << req.post.length() << crlf;
        r << "Content-Type: application/x-www-form-urlencoded" << crlf;
    }

    if(req.extraGetHeaders.length())
    {
        r << req.extraGetHeaders;
        if(req.extraGetHeaders.compare(req.extraGetHeaders.length() - 2, std::string::npos, crlf))
            r << crlf;
    }

    r << crlf; // header terminator

    // FIXME: appending this to the 'header' field is probably not a good idea
    if(post)
        r << req.post.str();

    req.header = r.str();

    return _EnqueueOrSend(req, enqueue);
}